

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testSharedFrameBuffer.cpp
# Opt level: O3

void __thiscall anon_unknown.dwarf_2fb4eb::ReaderThread::run(ReaderThread *this)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  
  Imf_3_4::RgbaInputFile::header();
  lVar3 = Imf_3_4::Header::dataWindow();
  iVar1 = *(int *)(lVar3 + 0xc);
  Imf_3_4::RgbaInputFile::header();
  lVar3 = Imf_3_4::Header::dataWindow();
  iVar2 = *(int *)(lVar3 + 4);
  for (iVar4 = this->_start; iVar4 <= iVar1 - iVar2; iVar4 = iVar4 + this->_step) {
    Imf_3_4::RgbaInputFile::readPixels((int)this->_infile);
  }
  IlmThread_3_4::Semaphore::post();
  return;
}

Assistant:

void
ReaderThread::run ()
{

    int num = _infile->header ().dataWindow ().max.y -
              _infile->header ().dataWindow ().min.y + 1;

    for (int i = _start; i < num; i += _step)
        _infile->readPixels (i);

    //
    // Signal that the thread has finished
    //

    threadSemaphore.post ();
}